

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O0

tsize_t MyRead(thandle_t opaque,void *dst,tsize_t size)

{
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  MyData *my_data;
  size_t local_18;
  
  local_18 = in_RDX;
  if ((ulong)in_RDI[1] < in_RDI[2] + in_RDX) {
    local_18 = in_RDI[1] - in_RDI[2];
  }
  if (0 < (long)local_18) {
    memcpy(in_RSI,(void *)(*in_RDI + in_RDI[2]),local_18);
    in_RDI[2] = local_18 + in_RDI[2];
  }
  return local_18;
}

Assistant:

static tsize_t MyRead(thandle_t opaque, void* dst, tsize_t size) {
  MyData* const my_data = (MyData*)opaque;
  if (my_data->pos + size > my_data->size) {
    size = (tsize_t)(my_data->size - my_data->pos);
  }
  if (size > 0) {
    memcpy(dst, my_data->data + my_data->pos, size);
    my_data->pos += size;
  }
  return size;
}